

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O2

bool tinyusdz::usda::anon_unknown_1::ToPrimSpecRec
               (size_t primSpecIdx,
               vector<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
               *primspec_nodes,PrimSpec *parent,string *err)

{
  pointer pPVar1;
  _Base_ptr p_Var2;
  size_t *psVar3;
  bool bVar4;
  size_type sVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  size_t *psVar8;
  int64_t vidx;
  VariantSetSpec variantSet;
  set<long,_std::less<long>,_std::allocator<long>_> variantChildrenIndices;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
  variantSets;
  PrimSpec variant;
  PrimSpec primspec;
  PrimSpec variantChildPrim;
  allocator local_1189;
  string *local_1188;
  ulong local_1180;
  _Base_ptr local_1178;
  _Base_ptr local_1170;
  PrimSpec *local_1168;
  pointer local_1160;
  _Base_ptr local_1158;
  _Base_ptr local_1150;
  PrimMetas *local_1148;
  _Base_ptr local_1140;
  undefined1 local_1138 [40];
  _Rb_tree_node_base local_1110;
  size_t local_10f0;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_10e8;
  string local_10b8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
  local_1098;
  undefined1 local_1068 [96];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  local_1008 [216];
  PrimMetas local_f30;
  PrimSpec local_b00;
  PrimSpec local_598;
  
  pPVar1 = (primspec_nodes->
           super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (primSpecIdx <
      (ulong)(((long)(primspec_nodes->
                     super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pPVar1) / 0x5b8)) {
    local_1160 = pPVar1 + primSpecIdx;
    local_1188 = err;
    local_1168 = parent;
    PrimSpec::PrimSpec(&local_b00,&local_1160->primSpec);
    local_10e8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_10e8._M_impl.super__Rb_tree_header._M_header;
    local_10e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_10e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_10e8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1098._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_1098._M_impl.super__Rb_tree_header._M_header;
    local_1098._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1098._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1098._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_1158 = (_Base_ptr)((long)&pPVar1[primSpecIdx].variantNodeMap._M_t._M_impl + 8);
    p_Var7 = *(_Base_ptr *)((long)&pPVar1[primSpecIdx].variantNodeMap._M_t._M_impl + 0x18);
    local_10e8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_10e8._M_impl.super__Rb_tree_header._M_header._M_left;
    local_1098._M_impl.super__Rb_tree_header._M_header._M_right =
         local_1098._M_impl.super__Rb_tree_header._M_header._M_left;
    while (p_Var7 != local_1158) {
      local_1138._0_8_ = local_1138 + 0x10;
      local_1138._8_8_ = 0;
      local_1138[0x10] = '\0';
      local_1110._M_color = _S_red;
      local_1110._M_parent = (_Base_ptr)0x0;
      local_1110._M_left = &local_1110;
      local_10f0 = 0;
      local_1178 = p_Var7 + 1;
      local_1170 = (_Base_ptr)&p_Var7[2]._M_parent;
      local_1150 = p_Var7;
      local_1110._M_right = local_1110._M_left;
      for (p_Var6 = p_Var7[2]._M_right; p_Var6 != local_1170;
          p_Var6 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6)) {
        local_1140 = p_Var6 + 1;
        PrimSpec::PrimSpec((PrimSpec *)local_1068);
        local_1148 = (PrimMetas *)(p_Var6 + 2);
        p_Var2 = p_Var6[0x23]._M_left;
        for (p_Var7 = p_Var6[0x23]._M_parent; p_Var7 != p_Var2;
            p_Var7 = (_Base_ptr)&p_Var7->_M_parent) {
          local_1180 = *(ulong *)p_Var7;
          sVar5 = ::std::set<long,_std::less<long>,_std::allocator<long>_>::count
                            ((set<long,_std::less<long>,_std::allocator<long>_> *)&local_10e8,
                             (key_type_conflict *)&local_1180);
          if (sVar5 != 0) {
            if (local_1188 != (string *)0x0) {
              ::std::__cxx11::string::string
                        ((string *)&local_10b8,"variant primIdx {} is referenced multiple times.\n",
                         &local_1189);
              fmt::format<long>((string *)&local_598,&local_10b8,(long *)&local_1180);
              ::std::__cxx11::string::operator=((string *)local_1188,(string *)&local_598);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
            }
            goto LAB_0012453f;
          }
          if (((long)local_1180 < 0) ||
             ((ulong)(((long)(primspec_nodes->
                             super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(primspec_nodes->
                            super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
                            )._M_impl.super__Vector_impl_data._M_start) / 0x5b8) < local_1180)) {
            if (local_1188 != (string *)0x0) {
              ::std::__cxx11::string::assign((char *)local_1188);
            }
            goto LAB_0012453f;
          }
          PrimSpec::PrimSpec(&local_598);
          bVar4 = ToPrimSpecRec(local_1180,primspec_nodes,&local_598,local_1188);
          if (!bVar4) {
            PrimSpec::~PrimSpec(&local_598);
            goto LAB_0012453f;
          }
          ::std::vector<tinyusdz::PrimSpec,std::allocator<tinyusdz::PrimSpec>>::
          emplace_back<tinyusdz::PrimSpec&>
                    ((vector<tinyusdz::PrimSpec,std::allocator<tinyusdz::PrimSpec>> *)
                     (local_1068 + 0x48),&local_598);
          PrimSpec::~PrimSpec(&local_598);
          ::std::_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>::
          _M_insert_unique<long_const&>
                    ((_Rb_tree<long,long,std::_Identity<long>,std::less<long>,std::allocator<long>>
                      *)&local_10e8,(long *)&local_1180);
        }
        PrimMetas::operator=(&local_f30,local_1148);
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
        ::operator=(local_1008,
                    (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                     *)&p_Var6[0x21]._M_right);
        ::std::__cxx11::string::_M_assign((string *)local_1138);
        ::std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec>>>
        ::_M_emplace_unique<std::__cxx11::string_const&,tinyusdz::PrimSpec>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec>>>
                    *)(local_1138 + 0x20),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1140,
                   (PrimSpec *)local_1068);
LAB_0012453f:
        PrimSpec::~PrimSpec((PrimSpec *)local_1068);
        if (p_Var7 != p_Var2) goto LAB_00124578;
      }
      ::std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::VariantSetSpec>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::VariantSetSpec>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::VariantSetSpec>>>
      ::_M_emplace_unique<std::__cxx11::string_const&,tinyusdz::VariantSetSpec>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::VariantSetSpec>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::VariantSetSpec>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::VariantSetSpec>>>
                  *)&local_1098,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1178,
                 (VariantSetSpec *)local_1138);
LAB_00124578:
      VariantSetSpec::~VariantSetSpec((VariantSetSpec *)local_1138);
      if (p_Var6 != local_1170) {
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
        ::~_Rb_tree(&local_1098);
        goto LAB_0012468f;
      }
      p_Var7 = (_Base_ptr)::std::_Rb_tree_increment((_Rb_tree_node_base *)local_1150);
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
    ::_M_move_assign(&local_b00._variantSets._M_t,&local_1098);
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::VariantSetSpec>_>_>
    ::~_Rb_tree(&local_1098);
    psVar8 = *(size_t **)
              &(local_1160->children).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
    psVar3 = *(pointer *)
              ((long)&(local_1160->children).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8);
LAB_00124605:
    if (psVar8 == psVar3) {
      PrimSpec::operator=(local_1168,&local_b00);
      bVar4 = true;
    }
    else {
      local_1068._0_8_ = *psVar8;
      sVar5 = ::std::set<long,_std::less<long>,_std::allocator<long>_>::count
                        ((set<long,_std::less<long>,_std::allocator<long>_> *)&local_10e8,
                         (key_type_conflict *)local_1068);
      if (sVar5 != 0) goto LAB_00124657;
      PrimSpec::PrimSpec((PrimSpec *)local_1068);
      bVar4 = ToPrimSpecRec(*psVar8,primspec_nodes,(PrimSpec *)local_1068,local_1188);
      if (bVar4) {
        ::std::vector<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>::
        emplace_back<tinyusdz::PrimSpec>(&local_b00._children,(PrimSpec *)local_1068);
        PrimSpec::~PrimSpec((PrimSpec *)local_1068);
        goto LAB_00124657;
      }
      PrimSpec::~PrimSpec((PrimSpec *)local_1068);
LAB_0012468f:
      bVar4 = false;
    }
    ::std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&local_10e8);
    PrimSpec::~PrimSpec(&local_b00);
  }
  else {
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
    bVar4 = false;
  }
  return bVar4;
LAB_00124657:
  psVar8 = psVar8 + 1;
  goto LAB_00124605;
}

Assistant:

bool ToPrimSpecRec(const size_t primSpecIdx,
                        std::vector<PrimSpecNode> &primspec_nodes, PrimSpec &parent, std::string *err) {

  if (primSpecIdx >= primspec_nodes.size()) {
    if (err) {
      (*err) += "Internal error; primSpecIdx exceeds primspec_nodes.size.";
    }
    return false;
  }

  const PrimSpecNode &node = primspec_nodes[primSpecIdx];

  PrimSpec primspec = node.primSpec;

  // Firstly process variants.
  std::set<int64_t> variantChildrenIndices; // record variantChildren indices
  {

    std::map<std::string, VariantSetSpec> variantSets;
    for (const auto &variantNodes : node.variantNodeMap) {
      DCOUT("variantSet " << variantNodes.first);
      VariantSetSpec variantSet;
      for (const auto &item : variantNodes.second) {
        DCOUT("variant " << item.first);
        PrimSpec variant; // variantNode can be represented as PrimSpec.
        for (const int64_t vidx : item.second.primChildren) {
          if (variantChildrenIndices.count(vidx)) {
            // Duplicated variant childrenIndices
            if (err) {
              (*err) = fmt::format("variant primIdx {} is referenced multiple times.\n", vidx);
            }
            return false;
          } else {
            // Add prim to variants
            if ((vidx >= 0) && (size_t(vidx) <= primspec_nodes.size())) {

              PrimSpec variantChildPrim; // dummy
              if (!ToPrimSpecRec(size_t(vidx), primspec_nodes, variantChildPrim, err)) {
                return false;
              }

              DCOUT(fmt::format("Added prim {} to variantSet {} : variant {}", variantChildPrim.name(), variantNodes.first, item.first));
              variant.children().emplace_back(variantChildPrim);
            } else {
              if (err) {
                (*err) = "primIndex exceeds prim_nodes.size()\n";
              }
              return false;
            }

            variantChildrenIndices.insert(vidx);
          }
        }

        variant.metas() = std::move(item.second.metas);
        variant.props() = std::move(item.second.props);

        variantSet.name = variantNodes.first;
        variantSet.variantSet.emplace(item.first, std::move(variant));
      }
      DCOUT(fmt::format("Add {} to variantSet", variantNodes.first));
      variantSets.emplace(variantNodes.first, std::move(variantSet));
    }
    primspec.variantSets() = std::move(variantSets);
  }

  for (const auto &cidx : node.children) {

    if (variantChildrenIndices.count(int64_t(cidx))) {
      // PrimSpec is already processed
      continue;
    }

    PrimSpec childPrimSpec;
    if (!ToPrimSpecRec(cidx, primspec_nodes, childPrimSpec, err)) {
      return false;
    }
    primspec.children().emplace_back(std::move(childPrimSpec));
  }

  parent = std::move(primspec);

  return true;
}